

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  int32 iVar1;
  int32 iVar2;
  __int_type_conflict _Var3;
  _func_int **pp_Var4;
  element_type *peVar5;
  element_type *peVar6;
  int iVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ptr<req_msg> req;
  ptr<cluster_config> c_conf;
  log_val_type local_9a;
  undefined1 local_99;
  ptr<peer> local_98;
  ptr<req_msg> local_88;
  undefined1 local_78 [32];
  shared_ptr<nuraft::buffer> local_58;
  __atomic_base<unsigned_long> local_48;
  element_type *local_38;
  
  _Var3 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->term_).super___atomic_base<unsigned_long>._M_i;
  iVar1 = ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->id_;
  lVar8 = (**(code **)(*(long *)(this->log_store_).
                                super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 0x10))();
  pp_Var4 = (_func_int **)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b13d0;
  local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  iVar2 = this->id_;
  p_Var9[1]._M_use_count = (int)_Var3;
  p_Var9[1]._M_weak_count = (int)(_Var3 >> 0x20);
  *(undefined4 *)&p_Var9[2]._vptr__Sp_counted_base = 0xc;
  *(int32 *)((long)&p_Var9[2]._vptr__Sp_counted_base + 4) = iVar2;
  p_Var9[2]._M_use_count = iVar1;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_005b1420;
  p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(long *)&p_Var9[3]._M_use_count = lVar8 + -1;
  p_Var9[4]._vptr__Sp_counted_base = pp_Var4;
  p_Var9[5]._M_use_count = 0;
  p_Var9[5]._M_weak_count = 0;
  p_Var9[4]._M_use_count = 0;
  p_Var9[4]._M_weak_count = 0;
  p_Var9[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var9;
  get_config((raft_server *)&stack0xffffffffffffffc0);
  local_48._M_i =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  cluster_config::serialize((cluster_config *)&local_58);
  local_9a = conf;
  local_78._0_8_ = (log_entry *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),(log_entry **)local_78,
             (allocator<nuraft::log_entry> *)&local_99,&local_48._M_i,&local_58,&local_9a);
  std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
  ::emplace_back<std::shared_ptr<nuraft::log_entry>>
            ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
              *)&p_Var9[4]._M_use_count,(shared_ptr<nuraft::log_entry> *)local_78);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if (local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peer::send_req(local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_98,&local_88,&this->ex_resp_handler_);
  if (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    iVar7 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar7) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar6 = (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_78,"sent join request to peer %d, %s",(ulong)(uint)peVar6->id_,
                 (peVar6->endpoint_)._M_dataplus._M_p);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"invite_srv_to_join_cluster",0x87,local_78);
      if ((log_entry *)local_78._0_8_ != (log_entry *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
    }
  }
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  if (local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster() {
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::join_cluster_request,
                         id_,
                         srv_to_join_->get_id(),
                         0L,
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    ptr<cluster_config> c_conf = get_config();
    req->log_entries().push_back
        ( cs_new<log_entry>
          ( state_->get_term(), c_conf->serialize(), log_val_type::conf ) );
    srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    p_in("sent join request to peer %d, %s",
         srv_to_join_->get_id(),
         srv_to_join_->get_endpoint().c_str());
}